

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_listener::asio_rpc_listener
          (asio_rpc_listener *this,asio_service_impl *_impl,io_service *io,ssl_context *ssl_ctx,
          ushort port,bool _enable_ssl,ptr<logger> *l)

{
  element_type *peVar1;
  int iVar2;
  char *pcVar3;
  undefined1 local_48 [32];
  
  (this->super_enable_shared_from_this<nuraft::asio_rpc_listener>)._M_weak_this.
  super___weak_ptr<nuraft::asio_rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<nuraft::asio_rpc_listener>)._M_weak_this.
  super___weak_ptr<nuraft::asio_rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)&PTR__asio_rpc_listener_005b1290;
  this->impl_ = _impl;
  this->io_svc_ = io;
  this->ssl_ctx_ = ssl_ctx;
  (this->listener_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->listener_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->listener_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->listener_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->listener_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)
   ((long)&(this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 1) = 0;
  *(undefined8 *)
   ((long)&(this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  local_48._24_4_ = 0;
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48._16_8_ = 0;
  local_48._2_2_ = port << 8 | port >> 8;
  local_48._0_2_ = 2;
  local_48._4_4_ = 0;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>(&this->acceptor_,io,(endpoint_type *)local_48,true,0);
  (this->active_sessions_).
  super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_sessions_).
  super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_sessions_).
  super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->session_id_cnt_).super___atomic_base<unsigned_long>._M_i = 1;
  (this->session_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->session_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->session_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->session_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->session_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  this->ssl_enabled_ = _enable_ssl;
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>,
             &l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar3 = "UNSECURED";
      if (this->ssl_enabled_ != false) {
        pcVar3 = "SSL ENABLED";
      }
      msg_if_given_abi_cxx11_((string *)local_48,"Raft ASIO listener initiated, %s",pcVar3);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"asio_rpc_listener",0x303,local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return;
}

Assistant:

asio_rpc_listener( asio_service_impl* _impl,
                       asio::io_service& io,
                       ssl_context& ssl_ctx,
                       ushort port,
                       bool _enable_ssl,
                       ptr<logger>& l )
        : impl_(_impl)
        , io_svc_(io)
        , ssl_ctx_(ssl_ctx)
        , handler_()
        , stopped_(false)
        , acceptor_(io, asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port))
        , session_id_cnt_(1)
        , ssl_enabled_(_enable_ssl)
        , l_(l)
    {
        p_in("Raft ASIO listener initiated, %s",
             ssl_enabled_ ? "SSL ENABLED" : "UNSECURED");
    }